

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O2

plugin plugin_manager_create(plugin_manager manager,char *name,void *impl,_func_void_plugin *dtor)

{
  int iVar1;
  plugin ppVar2;
  
  ppVar2 = plugin_manager_get(manager,name);
  if (ppVar2 == (plugin)0x0) {
    ppVar2 = plugin_loader_load(manager->l,name,impl,dtor);
    if (ppVar2 != (plugin)0x0) {
      iVar1 = plugin_manager_register(manager,ppVar2);
      if (iVar1 == 0) {
        return ppVar2;
      }
      plugin_destroy(ppVar2);
    }
    ppVar2 = (plugin)0x0;
  }
  return ppVar2;
}

Assistant:

plugin plugin_manager_create(plugin_manager manager, const char *name, void *impl, void (*dtor)(plugin))
{
	/* Check if plugin is already loaded and return it */
	plugin p = plugin_manager_get(manager, name);

	if (p != NULL)
	{
		return p;
	}

	/* Load the plugin (dynamic library) and initialize the interface */
	p = plugin_loader_load(manager->l, name, impl, dtor);

	if (p == NULL)
	{
		return NULL;
	}

	/* Register plugin into the plugin manager set */
	if (plugin_manager_register(manager, p) != 0)
	{
		plugin_destroy(p);
		return NULL;
	}

	return p;
}